

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::StrpTimeFormat>
          (Deserializer *this,field_id_t field_id,char *tag,StrpTimeFormat *ret)

{
  undefined6 in_register_00000032;
  StrpTimeFormat val;
  StrTimeFormat SStack_88;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  (*this->_vptr_Deserializer[6])(this);
  StrpTimeFormat::Deserialize((StrpTimeFormat *)&SStack_88,this);
  (*this->_vptr_Deserializer[7])(this);
  ::std::__cxx11::string::_M_assign((string *)&(ret->super_StrTimeFormat).format_specifier);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::operator=
            (&(ret->super_StrTimeFormat).specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
             &SStack_88.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(ret->super_StrTimeFormat).literals,
              &SStack_88.literals.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  (ret->super_StrTimeFormat).constant_size = SStack_88.constant_size;
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&(ret->super_StrTimeFormat).numeric_width.super_vector<int,_std::allocator<int>_>,
             &SStack_88.numeric_width.super_vector<int,_std::allocator<int>_>);
  StrTimeFormat::~StrTimeFormat(&SStack_88);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}